

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_22::Array2Struct::replaceCurrent(Array2Struct *this,Expression *expression)

{
  EscapeAnalyzer *this_00;
  Expression *old;
  Expression *expression_local;
  Array2Struct *this_local;
  
  this_00 = this->analyzer;
  old = Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
        ::getCurrent((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                      *)this);
  EscapeAnalyzer::applyOldInteractionToReplacement(this_00,old,expression);
  Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
  ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                    *)this,expression);
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    analyzer.applyOldInteractionToReplacement(getCurrent(), expression);
    PostWalker<Array2Struct>::replaceCurrent(expression);
    return expression;
  }